

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O0

Npn_Obj_t * Npn_ManAdd(Npn_Man_t *p,word uTruth)

{
  int iVar1;
  Npn_Obj_t *pNVar2;
  int iVar3;
  Npn_Obj_t *local_40;
  int *piStack_30;
  int Key;
  int *pPlace;
  Npn_Obj_t *pEntry;
  word uTruth_local;
  Npn_Man_t *p_local;
  
  iVar1 = Npn_ManHash(p,uTruth);
  if (p->nEntries == p->nBufferSize) {
    p->nBufferSize = p->nBufferSize << 1;
    if (p->pBuffer == (Npn_Obj_t *)0x0) {
      local_40 = (Npn_Obj_t *)malloc((long)p->nBufferSize << 4);
    }
    else {
      local_40 = (Npn_Obj_t *)realloc(p->pBuffer,(long)p->nBufferSize << 4);
    }
    p->pBuffer = local_40;
  }
  pPlace = (int *)Npn_ManObj(p,p->pBins[iVar1]);
  piStack_30 = p->pBins + iVar1;
  while( true ) {
    if (pPlace == (int *)0x0) {
      *piStack_30 = p->nEntries;
      if (p->nEntries < p->nBufferSize) {
        iVar1 = p->nEntries;
        p->nEntries = iVar1 + 1;
        pNVar2 = Npn_ManObj(p,iVar1);
        pNVar2->uTruth = uTruth;
        pNVar2->Count = 1;
        pNVar2->iNext = 0;
        iVar1 = p->nEntries;
        iVar3 = p->nBins * 3;
        if (iVar1 != iVar3 && SBORROW4(iVar1,iVar3) == iVar1 + p->nBins * -3 < 0) {
          Npn_ManResize(p);
        }
        return pNVar2;
      }
      __assert_fail("p->nEntries < p->nBufferSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcNpnSave.c"
                    ,0x1cc,"Npn_Obj_t *Npn_ManAdd(Npn_Man_t *, word)");
    }
    if (*(word *)pPlace == uTruth) break;
    piStack_30 = pPlace + 3;
    pPlace = (int *)Npn_ManObj(p,pPlace[3]);
  }
  pPlace[2] = pPlace[2] + 1;
  return (Npn_Obj_t *)pPlace;
}

Assistant:

Npn_Obj_t * Npn_ManAdd( Npn_Man_t * p, word uTruth )
{
    Npn_Obj_t * pEntry;
    int * pPlace, Key = Npn_ManHash( p, uTruth );
    // resize the link storage if needed
    if ( p->nEntries == p->nBufferSize )
    {
        p->nBufferSize *= 2;
        p->pBuffer = ABC_REALLOC( Npn_Obj_t, p->pBuffer, p->nBufferSize );
    }
    // find the entry
    for ( pEntry = Npn_ManObj(p, p->pBins[Key]), 
          pPlace = p->pBins + Key; 
          pEntry; 
          pPlace = &pEntry->iNext, 
          pEntry = Npn_ManObj(p, pEntry->iNext) )
        if ( pEntry->uTruth == uTruth )
        {
            pEntry->Count++;
            return pEntry;
        }
    // create new entry
    *pPlace = p->nEntries;
    assert( p->nEntries < p->nBufferSize );
    pEntry = Npn_ManObj( p, p->nEntries++ );
    pEntry->uTruth = uTruth;
    pEntry->Count = 1;
    pEntry->iNext = 0;
    // resize the table if needed
    if ( p->nEntries > 3 * p->nBins )
        Npn_ManResize( p );
    return pEntry;
}